

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# opennurbs_linear_workflow.cpp
# Opt level: O0

void __thiscall ON_LinearWorkflow::ON_LinearWorkflow(ON_LinearWorkflow *this,ON_LinearWorkflow *lw)

{
  CImpl *this_00;
  ON_LinearWorkflow *lw_local;
  ON_LinearWorkflow *this_local;
  
  this->_vptr_ON_LinearWorkflow = (_func_int **)&PTR__ON_LinearWorkflow_00b71a00;
  this_00 = (CImpl *)operator_new(0x40);
  CImpl::CImpl(this_00);
  this->_impl = this_00;
  (*this->_vptr_ON_LinearWorkflow[2])(this,lw);
  return;
}

Assistant:

ON_LinearWorkflow::ON_LinearWorkflow(const ON_LinearWorkflow& lw)
{
  _impl = new CImpl;
  operator = (lw);
}